

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void update_player_regions(level *lev)

{
  boolean bVar1;
  int local_14;
  int i;
  level *lev_local;
  
  local_14 = 0;
  do {
    if (lev->n_regions <= local_14) {
      return;
    }
    if (lev->regions[local_14]->attach_2_u == '\0') {
      bVar1 = inside_region(lev->regions[local_14],(int)u.ux,(int)u.uy);
      if (bVar1 == '\0') goto LAB_002bb283;
      lev->regions[local_14]->player_flags = lev->regions[local_14]->player_flags | 1;
    }
    else {
LAB_002bb283:
      lev->regions[local_14]->player_flags = lev->regions[local_14]->player_flags & 0xfe;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void update_player_regions(struct level *lev)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (!lev->regions[i]->attach_2_u && inside_region(lev->regions[i], u.ux, u.uy))
	    set_hero_inside(lev->regions[i]);
	else
	    clear_hero_inside(lev->regions[i]);
}